

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void luaC_fullgc(lua_State *L,int isemergency)

{
  global_State *g;
  
  g = L->l_G;
  if (g->gcemergency != '\0') {
    __assert_fail("!g->gcemergency",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                  ,0x71e,"void luaC_fullgc(lua_State *, int)");
  }
  g->gcemergency = (lu_byte)isemergency;
  if (g->gckind == '\0') {
    if (g->gcstate < 3) {
      entersweep(L);
    }
    luaC_runtilstate(L,0x100);
    luaC_runtilstate(L,1);
    g->gcstate = '\x01';
    luaC_runtilstate(L,0x80);
    if (g->GCestimate != g->GCdebt + g->totalbytes) {
      __assert_fail("g->GCestimate == ((lu_mem)((g)->totalbytes + (g)->GCdebt))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x711,"void fullinc(lua_State *, global_State *)");
    }
    luaC_runtilstate(L,0x100);
    setpause(g);
  }
  else {
    fullgen(L,g);
  }
  g->gcemergency = '\0';
  return;
}

Assistant:

void luaC_fullgc (lua_State *L, int isemergency) {
  global_State *g = G(L);
  lua_assert(!g->gcemergency);
  g->gcemergency = isemergency;  /* set flag */
  if (g->gckind == KGC_INC)
    fullinc(L, g);
  else
    fullgen(L, g);
  g->gcemergency = 0;
}